

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void test_translate(string *original,string *expected,locale *l,string *domain)

{
  string *in_RCX;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000d48;
  locale *in_stack_00000d50;
  string *in_stack_00000d58;
  string *in_stack_00000d60;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RDI);
  std::__cxx11::string::string(local_60,in_RSI);
  std::__cxx11::string::string(local_90,in_RCX);
  strings_equal<char>(in_stack_00000d60,in_stack_00000d58,in_stack_00000d50,in_stack_00000d48);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_b0,in_RDI);
  std::__cxx11::string::string(local_d0,in_RSI);
  std::__cxx11::string::string(local_f0,in_RCX);
  strings_equal<wchar_t>(in_stack_00000d60,in_stack_00000d58,in_stack_00000d50,in_stack_00000d48);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  return;
}

Assistant:

void test_translate(std::string original,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(original,expected,l,domain);
    strings_equal<wchar_t>(original,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(original,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(original,expected,l,domain);
    #endif
}